

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O3

bool __thiscall rlist::listDelNode(rlist *this,int pos)

{
  listNode **pplVar1;
  listNode *plVar2;
  listNode *plVar3;
  unsigned_long uVar4;
  int iVar5;
  listNode *plVar6;
  long lVar7;
  
  this->length = 0;
  plVar6 = this->rl->head;
  uVar4 = 0;
  plVar3 = plVar6;
  if (plVar6 != (listNode *)0x0) {
    do {
      uVar4 = uVar4 + 1;
      pplVar1 = &plVar3->next;
      plVar3 = *pplVar1;
    } while (*pplVar1 != (listNode *)0x0);
    this->view = (listNode *)0x0;
    this->length = uVar4;
  }
  this->rl->len = uVar4;
  iVar5 = pos + -1;
  lVar7 = (long)iVar5;
  if (lVar7 < (long)uVar4) {
    this->view = plVar6;
    if (iVar5 != 0) {
      do {
        plVar6 = plVar6->next;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      this->view = plVar6;
    }
    plVar3 = plVar6->prev;
    plVar2 = plVar6->next;
    plVar3->next = plVar2;
    plVar2->prev = plVar3;
    operator_delete(plVar6);
  }
  return lVar7 < (long)uVar4;
}

Assistant:

bool rlist::listDelNode(int pos){
    long tmp=rlist::listLength();
    pos--;
    if(tmp>pos){
        view=rl->head;
        for(int i=0;i!=pos;i++)
            view=view->next;
        rlist::_free((void *)view);
        return true;
    } 
    return false;
}